

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O3

void __thiscall cppjieba::FullSegment::FullSegment(FullSegment *this,string *dictPath)

{
  DictTrie *this_00;
  string local_40;
  
  SegmentBase::SegmentBase(&this->super_SegmentBase);
  (this->super_SegmentBase)._vptr_SegmentBase = (_func_int **)&PTR__FullSegment_001825d8;
  this_00 = (DictTrie *)operator_new(0xd0);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  DictTrie::DictTrie(this_00,dictPath,&local_40,WordWeightMedian);
  this->dictTrie_ = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  this->isNeedDestroy_ = true;
  return;
}

Assistant:

FullSegment(const string& dictPath) {
    dictTrie_ = new DictTrie(dictPath);
    isNeedDestroy_ = true;
  }